

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

void __thiscall flatbuffers::IDLOptions::IDLOptions(IDLOptions *this)

{
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59 [41];
  
  this->gen_jvmstatic = false;
  this->use_flexbuffers = false;
  this->strict_json = false;
  this->output_default_scalars_in_json = false;
  this->indent_step = 2;
  this->cpp_minify_enums = false;
  this->output_enum_identifiers = true;
  this->prefixed_enums = true;
  this->scoped_enums = false;
  this->emit_min_max_enum_values = true;
  this->swift_implementation_only = false;
  this->include_dependence_headers = true;
  this->gen_compare = false;
  this->mutable_buffer = false;
  this->one_file = false;
  this->proto_mode = false;
  this->proto_oneof_union = false;
  this->generate_all = false;
  this->skip_unexpected_fields_in_json = false;
  this->generate_name_strings = false;
  this->generate_object_based_api = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->cpp_object_api_pointer_type,"std::unique_ptr",local_59);
  (this->cpp_object_api_string_type)._M_dataplus._M_p =
       (pointer)&(this->cpp_object_api_string_type).field_2;
  (this->cpp_object_api_string_type)._M_string_length = 0;
  (this->cpp_object_api_string_type).field_2._M_local_buf[0] = '\0';
  this->cpp_object_api_string_flexible_constructor = false;
  this->cpp_object_api_field_case_style = CaseStyle_Unchanged;
  this->cpp_direct_copy = true;
  this->gen_nullable = false;
  (this->java_package_prefix)._M_dataplus._M_p = (pointer)&(this->java_package_prefix).field_2;
  (this->java_package_prefix)._M_string_length = 0;
  (this->java_package_prefix).field_2._M_local_buf[0] = '\0';
  this->java_checkerframework = false;
  this->gen_generated = false;
  this->gen_json_coders = false;
  (this->object_prefix)._M_dataplus._M_p = (pointer)&(this->object_prefix).field_2;
  (this->object_prefix)._M_string_length = 0;
  (this->object_prefix).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->object_suffix,"T",&local_5a);
  this->union_value_namespacing = true;
  this->allow_non_utf8 = false;
  this->natural_utf8 = false;
  (this->include_prefix)._M_dataplus._M_p = (pointer)&(this->include_prefix).field_2;
  (this->include_prefix)._M_string_length = 0;
  (this->include_prefix).field_2._M_local_buf[0] = '\0';
  this->binary_schema_absolute_paths = false;
  this->keep_prefix = false;
  this->binary_schema_comments = false;
  this->binary_schema_builtins = false;
  this->binary_schema_gen_embed = false;
  (this->go_import)._M_dataplus._M_p = (pointer)&(this->go_import).field_2;
  (this->go_import)._M_string_length = 0;
  (this->go_import).field_2._M_local_buf[0] = '\0';
  (this->go_namespace)._M_dataplus._M_p = (pointer)&(this->go_namespace).field_2;
  (this->go_namespace)._M_string_length = 0;
  (this->go_namespace).field_2._M_local_buf[0] = '\0';
  (this->go_module_name)._M_dataplus._M_p = (pointer)&(this->go_module_name).field_2;
  (this->go_module_name)._M_string_length = 0;
  (this->go_module_name).field_2._M_local_buf[0] = '\0';
  this->protobuf_ascii_alike = false;
  this->size_prefixed = false;
  (this->root_type)._M_dataplus._M_p = (pointer)&(this->root_type).field_2;
  (this->root_type)._M_string_length = 0;
  (this->root_type).field_2._M_local_buf[0] = '\0';
  this->force_defaults = false;
  this->java_primitive_has_method = false;
  this->cs_gen_json_serializer = false;
  (this->cpp_includes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cpp_includes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cpp_includes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cpp_std)._M_dataplus._M_p = (pointer)&(this->cpp_std).field_2;
  (this->cpp_std)._M_string_length = 0;
  (this->cpp_std).field_2._M_local_buf[0] = '\0';
  this->cpp_static_reflection = false;
  (this->proto_namespace_suffix)._M_dataplus._M_p = (pointer)&(this->proto_namespace_suffix).field_2
  ;
  (this->proto_namespace_suffix)._M_string_length = 0;
  (this->proto_namespace_suffix).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->filename_suffix,"_generated",&local_5b);
  (this->filename_extension)._M_dataplus._M_p = (pointer)&(this->filename_extension).field_2;
  (this->filename_extension)._M_string_length = 0;
  (this->filename_extension).field_2._M_local_buf[0] = '\0';
  this->no_warnings = false;
  this->warnings_as_errors = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->project_root,"",&local_5c);
  this->cs_global_alias = false;
  this->json_nested_flatbuffers = true;
  this->json_nested_flexbuffers = true;
  this->json_nested_legacy_flatbuffers = false;
  this->ts_flat_files = false;
  this->ts_entry_points = false;
  this->ts_no_import_ext = false;
  this->no_leak_private_annotations = false;
  this->require_json_eof = true;
  this->keep_proto_id = false;
  this->python_no_type_prefix_suffix = false;
  this->python_typing = false;
  (this->python_version)._M_dataplus._M_p = (pointer)&(this->python_version).field_2;
  (this->python_version)._M_string_length = 0;
  (this->python_version).field_2._M_local_buf[0] = '\0';
  this->python_gen_numpy = true;
  this->ts_omit_entrypoint = false;
  this->proto_id_gap_action = WARNING;
  this->mini_reflect = kNone;
  this->lang_to_generate = 0;
  *(undefined4 *)((long)&this->mini_reflect + 3) = 0;
  this->set_empty_strings_to_null = true;
  this->set_empty_vectors_to_null = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->grpc_filename_suffix,".fb",&local_5d);
  this->grpc_use_system_headers = true;
  (this->grpc_search_path)._M_dataplus._M_p = (pointer)&(this->grpc_search_path).field_2;
  (this->grpc_search_path)._M_string_length = 0;
  (this->grpc_search_path).field_2._M_local_buf[0] = '\0';
  (this->grpc_additional_headers).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grpc_additional_headers).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->grpc_additional_headers).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->grpc_additional_headers).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  return;
}

Assistant:

IDLOptions()
      : gen_jvmstatic(false),
        use_flexbuffers(false),
        strict_json(false),
        output_default_scalars_in_json(false),
        indent_step(2),
        cpp_minify_enums(false),
        output_enum_identifiers(true),
        prefixed_enums(true),
        scoped_enums(false),
        emit_min_max_enum_values(true),
        swift_implementation_only(false),
        include_dependence_headers(true),
        mutable_buffer(false),
        one_file(false),
        proto_mode(false),
        proto_oneof_union(false),
        generate_all(false),
        skip_unexpected_fields_in_json(false),
        generate_name_strings(false),
        generate_object_based_api(false),
        gen_compare(false),
        cpp_object_api_pointer_type("std::unique_ptr"),
        cpp_object_api_string_flexible_constructor(false),
        cpp_object_api_field_case_style(CaseStyle_Unchanged),
        cpp_direct_copy(true),
        gen_nullable(false),
        java_checkerframework(false),
        gen_generated(false),
        gen_json_coders(false),
        object_suffix("T"),
        union_value_namespacing(true),
        allow_non_utf8(false),
        natural_utf8(false),
        keep_prefix(false),
        binary_schema_comments(false),
        binary_schema_builtins(false),
        binary_schema_gen_embed(false),
        binary_schema_absolute_paths(false),
        protobuf_ascii_alike(false),
        size_prefixed(false),
        force_defaults(false),
        java_primitive_has_method(false),
        cs_gen_json_serializer(false),
        cpp_static_reflection(false),
        filename_suffix("_generated"),
        filename_extension(),
        no_warnings(false),
        warnings_as_errors(false),
        project_root(""),
        cs_global_alias(false),
        json_nested_flatbuffers(true),
        json_nested_flexbuffers(true),
        json_nested_legacy_flatbuffers(false),
        ts_flat_files(false),
        ts_entry_points(false),
        ts_no_import_ext(false),
        no_leak_private_annotations(false),
        require_json_eof(true),
        keep_proto_id(false),
        python_no_type_prefix_suffix(false),
        python_typing(false),
        python_gen_numpy(true),
        ts_omit_entrypoint(false),
        proto_id_gap_action(ProtoIdGapAction::WARNING),
        mini_reflect(IDLOptions::kNone),
        require_explicit_ids(false),
        rust_serialize(false),
        rust_module_root_file(false),
        lang_to_generate(0),
        set_empty_strings_to_null(true),
        set_empty_vectors_to_null(true),
        grpc_filename_suffix(".fb"),
        grpc_use_system_headers(true),
        grpc_python_typed_handlers(false) {}